

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O0

dict * wb_dict_new(dict_compare_func cmp_func)

{
  wb_tree *pwVar1;
  dict *dct;
  dict_compare_func cmp_func_local;
  
  cmp_func_local = (dict_compare_func)(*dict_malloc_func)(0x10);
  if (cmp_func_local != (dict_compare_func)0x0) {
    pwVar1 = wb_tree_new(cmp_func);
    *(wb_tree **)cmp_func_local = pwVar1;
    if (pwVar1 == (wb_tree *)0x0) {
      (*dict_free_func)(cmp_func_local);
      cmp_func_local = (dict_compare_func)0x0;
    }
    else {
      *(dict_vtable **)(cmp_func_local + 8) = &wb_tree_vtable;
    }
  }
  return (dict *)cmp_func_local;
}

Assistant:

dict*
wb_dict_new(dict_compare_func cmp_func)
{
    dict* dct = MALLOC(sizeof(*dct));
    if (dct) {
	if (!(dct->_object = wb_tree_new(cmp_func))) {
	    FREE(dct);
	    return NULL;
	}
	dct->_vtable = &wb_tree_vtable;
    }
    return dct;
}